

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramLimitCase::iterate
          (GeometryProgramLimitCase *this)

{
  size_type *psVar1;
  ostringstream *poVar2;
  TestLog *pTVar3;
  RenderContext *renderCtx;
  bool bVar4;
  int iVar5;
  GLenum err;
  undefined4 extraout_var;
  long *plVar6;
  undefined8 *puVar7;
  ShaderProgram *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *plVar10;
  char *pcVar11;
  undefined8 uVar12;
  long lVar13;
  ScopedLogSection section;
  CallLogWrapper gl;
  string geometrySource;
  StateQueryMemoryWriteGuard<int> state;
  UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> program;
  ResultCollector result;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  string local_338;
  ScopedLogSection local_318;
  value_type local_310;
  undefined1 local_2f0 [32];
  string local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  string local_288;
  ShaderProgram *local_268;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_260;
  ContextType local_24c;
  ContextType local_248;
  ContextType local_244;
  string local_240;
  string local_220;
  ResultCollector local_200;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [8];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_200,pTVar3,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_288._M_dataplus._M_p = (pointer)0xdededededededede;
  local_288._M_string_length._0_4_ = 0xdededede;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_2f0,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_2f0[0x10] = true;
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)local_2f0,this->m_apiName,
             (GLint *)((long)&local_288._M_dataplus._M_p + 4));
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_2f0);
  glu::checkError(err,"getIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x11be);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  local_360._0_8_ = glu::getGettableStateName;
  local_360._8_4_ = this->m_apiName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_360,(ostream *)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
  std::ostream::operator<<(poVar2,local_288._M_dataplus._M_p._4_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_288,&local_200);
  if (bVar4) {
    iVar5 = local_288._M_dataplus._M_p._4_4_;
    if (this->m_limit <= local_288._M_dataplus._M_p._4_4_) {
      pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Types","");
      local_360._0_8_ = &local_350;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"Alternative queries","");
      tcu::ScopedLogSection::ScopedLogSection
                (&local_318,pTVar3,(string *)local_1b0,(string *)local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != &local_350) {
        operator_delete((void *)local_360._0_8_,local_350._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      deqp::gls::StateQueryUtil::verifyStateInteger
                (&local_200,(CallLogWrapper *)local_2f0,this->m_apiName,iVar5,QUERY_BOOLEAN);
      deqp::gls::StateQueryUtil::verifyStateInteger
                (&local_200,(CallLogWrapper *)local_2f0,this->m_apiName,iVar5,QUERY_INTEGER64);
      deqp::gls::StateQueryUtil::verifyStateInteger
                (&local_200,(CallLogWrapper *)local_2f0,this->m_apiName,iVar5,QUERY_FLOAT);
      tcu::TestLog::endSection(local_318.m_log);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_2f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points) in;\nlayout(points, max_vertices = 1) out;\nvoid main ()\n{\n\t// Building the shader will fail if the constant value is not the expected\n\tconst mediump int cArraySize = (gl_"
                     ,&this->m_glslName);
      plVar6 = (long *)std::__cxx11::string::append(local_2b0);
      psVar1 = &local_310._M_string_length;
      plVar10 = plVar6 + 2;
      if ((size_type *)*plVar6 == (size_type *)plVar10) {
        local_310._M_string_length = *plVar10;
        local_310.field_2._M_allocated_capacity = plVar6[3];
        local_318.m_log = (TestLog *)psVar1;
      }
      else {
        local_310._M_string_length = *plVar10;
        local_318.m_log = (TestLog *)*plVar6;
      }
      local_310._M_dataplus._M_p = (pointer)plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<(local_1b0,iVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      pcVar11 = (char *)0xf;
      if (local_318.m_log != (TestLog *)psVar1) {
        pcVar11 = (char *)local_310._M_string_length;
      }
      if (pcVar11 < local_310._M_dataplus._M_p + local_338._M_string_length) {
        uVar12 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          uVar12 = local_338.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_310._M_dataplus._M_p + local_338._M_string_length)
        goto LAB_014002a1;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_338,0,(char *)0x0,(ulong)local_318.m_log);
      }
      else {
LAB_014002a1:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_318,(ulong)local_338._M_dataplus._M_p);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar9) {
        local_350._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_350._8_8_ = puVar7[3];
        local_360._0_8_ = &local_350;
      }
      else {
        local_350._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_360._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar7;
      }
      local_360._8_8_ = puVar7[1];
      *puVar7 = paVar9;
      puVar7[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      plVar6 = (long *)std::__cxx11::string::append(local_360);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar9) {
        local_2d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2d0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != &local_350) {
        operator_delete((void *)local_360._0_8_,local_350._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        (ulong)(local_338.field_2._M_allocated_capacity + 1));
      }
      if (local_318.m_log != (TestLog *)psVar1) {
        operator_delete(local_318.m_log,(ulong)(local_310._M_string_length + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._0_8_ != &local_2a0) {
        operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
      }
      pSVar8 = (ShaderProgram *)operator_new(0xd0);
      renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
      local_100[0x10] = 0;
      local_100._17_8_ = 0;
      local_100._0_8_ = (pointer)0x0;
      local_100[8] = 0;
      local_100._9_7_ = 0;
      memset(local_1b0,0,0xac);
      local_2f0._0_8_ = local_2f0 + 0x10;
      local_268 = pSVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "${GLSL_VERSION_DECL}\nvoid main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
                 ,"");
      local_244.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      specializeShader(&local_338,(string *)local_2f0,&local_244);
      local_360._0_8_ = local_360._0_8_ & 0xffffffff00000000;
      local_360._8_8_ = local_350._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_360 + 8),local_338._M_dataplus._M_p,
                 local_338._M_dataplus._M_p + local_338._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_360._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_360 + 8));
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_220,
                 "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
                 ,"");
      local_248.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      specializeShader(&local_288,&local_220,&local_248);
      local_318.m_log._0_4_ = 1;
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_310,local_288._M_dataplus._M_p,
                 local_288._M_dataplus._M_p +
                 CONCAT44(local_288._M_string_length._4_4_,(undefined4)local_288._M_string_length));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_318.m_log & 0xffffffff) * 0x18),&local_310);
      local_24c.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      specializeShader(&local_240,&local_2d0,&local_24c);
      local_2b0._0_4_ = 2;
      local_2b0._8_8_ = local_2a0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_2b0 + 8),local_240._M_dataplus._M_p,
                 local_240._M_dataplus._M_p + local_240._M_string_length);
      pSVar8 = local_268;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_2b0._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_2b0 + 8));
      glu::ShaderProgram::ShaderProgram(pSVar8,renderCtx,(ProgramSources *)local_1b0);
      local_260.m_data.ptr = pSVar8;
      if ((char *)local_2b0._8_8_ != local_2a0._M_local_buf + 8) {
        operator_delete((void *)local_2b0._8_8_,local_2a0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_360._8_8_ != local_350._M_local_buf + 8) {
        operator_delete((void *)local_360._8_8_,local_350._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        (ulong)(local_338.field_2._M_allocated_capacity + 1));
      }
      if ((Functions *)local_2f0._0_8_ != (Functions *)(local_2f0 + 0x10)) {
        operator_delete((void *)local_2f0._0_8_,CONCAT71(local_2f0._17_7_,local_2f0[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_120);
      lVar13 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + lVar13));
        lVar13 = lVar13 + -0x18;
      } while (lVar13 != -0x18);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Building a test shader to verify GLSL constant ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(this->m_glslName)._M_dataplus._M_p,
                 (this->m_glslName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," value.",7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      local_260.m_data.ptr);
      bVar4 = ((local_260.m_data.ptr)->m_program).m_info.linkOk;
      if (bVar4 == false) {
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Shader build failed","");
        tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
        }
        tcu::ResultCollector::setTestContextResult
                  (&local_200,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Build ok",8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
      }
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                (&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar4 != false) {
        tcu::ResultCollector::setTestContextResult
                  (&local_200,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      }
      goto LAB_014003c2;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::ostream::operator<<(local_1b0,this->m_limit);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,0x1c7dfd2);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_2a0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2a0._8_8_ = plVar6[3];
      local_2b0._0_8_ = &local_2a0;
    }
    else {
      local_2a0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2b0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_2b0._8_8_ = plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_2b0);
    psVar1 = &local_310._M_string_length;
    plVar10 = plVar6 + 2;
    if ((size_type *)*plVar6 == (size_type *)plVar10) {
      local_310._M_string_length = *plVar10;
      local_310.field_2._M_allocated_capacity = plVar6[3];
      local_318.m_log = (TestLog *)psVar1;
    }
    else {
      local_310._M_string_length = *plVar10;
      local_318.m_log = (TestLog *)*plVar6;
    }
    local_310._M_dataplus._M_p = (pointer)plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::ostream::operator<<(local_1b0,local_288._M_dataplus._M_p._4_4_);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
    pcVar11 = (char *)0xf;
    if (local_318.m_log != (TestLog *)psVar1) {
      pcVar11 = (char *)local_310._M_string_length;
    }
    if (pcVar11 < local_310._M_dataplus._M_p + local_338._M_string_length) {
      uVar12 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        uVar12 = local_338.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_310._M_dataplus._M_p + local_338._M_string_length)
      goto LAB_014001da;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,(ulong)local_318.m_log)
      ;
    }
    else {
LAB_014001da:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_338._M_dataplus._M_p)
      ;
    }
    local_360._0_8_ = &local_350;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar9) {
      local_350._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_350._8_8_ = puVar7[3];
    }
    else {
      local_350._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_360._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar7;
    }
    local_360._8_8_ = puVar7[1];
    *puVar7 = paVar9;
    puVar7[1] = 0;
    paVar9->_M_local_buf[0] = '\0';
    tcu::ResultCollector::fail(&local_200,(string *)local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != &local_350) {
      operator_delete((void *)local_360._0_8_,local_350._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if (local_318.m_log != (TestLog *)psVar1) {
      operator_delete(local_318.m_log,(ulong)(local_310._M_string_length + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._0_8_ != &local_2a0) {
      operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&local_200,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_2f0);
LAB_014003c2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

GeometryProgramLimitCase::IterateResult GeometryProgramLimitCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	int						limit;

	// query limit
	{
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>	state;
		glu::CallLogWrapper											gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

		gl.enableLogging(true);
		gl.glGetIntegerv(m_apiName, &state);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getIntegerv()");

		m_testCtx.getLog() << tcu::TestLog::Message << glu::getGettableStateStr(m_apiName) << " = " << state << tcu::TestLog::EndMessage;

		if (!state.verifyValidity(result))
		{
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		if (state < m_limit)
		{
			result.fail("Minimum value = " + de::toString(m_limit) + ", got " + de::toString(state.get()));
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		limit = state;

		// verify other getters
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_BOOLEAN);
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_INTEGER64);
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_FLOAT);
		}
	}

	// verify limit is the same in GLSL
	{
		static const char* const vertexSource =		"${GLSL_VERSION_DECL}\n"
													"void main ()\n"
													"{\n"
													"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
													"}\n";
		static const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"layout(location = 0) out mediump vec4 fragColor;\n"
													"void main ()\n"
													"{\n"
													"	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
													"}\n";
		const std::string geometrySource =			"${GLSL_VERSION_DECL}\n"
													"${GLSL_EXT_GEOMETRY_SHADER}"
													"layout(points) in;\n"
													"layout(points, max_vertices = 1) out;\n"
													"void main ()\n"
													"{\n"
													"	// Building the shader will fail if the constant value is not the expected\n"
													"	const mediump int cArraySize = (gl_" + m_glslName + " == " + de::toString(limit) + ") ? (1) : (-1);\n"
													"	float[cArraySize] fArray;\n"
													"	fArray[0] = 0.0f;\n"
													"	gl_Position = vec4(0.0, 0.0, 0.0, fArray[0]);\n"
													"	EmitVertex();\n"
													"}\n";

		const de::UniquePtr<glu::ShaderProgram> program(new glu::ShaderProgram(m_context.getRenderContext(),
																			   glu::ProgramSources()
																			   << glu::VertexSource(specializeShader(vertexSource, m_context.getRenderContext().getType()))
																			   << glu::FragmentSource(specializeShader(fragmentSource, m_context.getRenderContext().getType()))
																			   << glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType()))));

		m_testCtx.getLog() << tcu::TestLog::Message << "Building a test shader to verify GLSL constant " << m_glslName << " value." << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << *program;

		if (!program->isOk())
		{
			// compile failed, assume static assert failed
			result.fail("Shader build failed");
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Build ok" << tcu::TestLog::EndMessage;
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}